

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O1

void cullPoints2(int n,cbtScalar *p,int m,int i0,int *iret)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  cbtScalar cVar13;
  cbtScalar cVar14;
  float fVar15;
  undefined1 in_register_000014c4 [12];
  int avail [8];
  cbtScalar A [8];
  int aiStack_78 [8];
  float afStack_58 [10];
  
  if (n == 1) {
    cVar14 = *p;
    cVar13 = p[1];
  }
  else if (n == 2) {
    cVar14 = (*p + p[2]) * 0.5;
    cVar13 = (p[1] + p[3]) * 0.5;
  }
  else {
    fVar10 = 0.0;
    auVar12 = ZEXT816(0) << 0x40;
    auVar11 = ZEXT816(0) << 0x40;
    if (1 < n) {
      uVar6 = 0;
      fVar10 = 0.0;
      do {
        auVar1 = vfmsub231ss_fma(ZEXT416((uint)(p[uVar6 * 2 + 1] * p[uVar6 * 2 + 2])),
                                 ZEXT416((uint)p[uVar6 * 2]),ZEXT416((uint)p[uVar6 * 2 + 3]));
        fVar10 = fVar10 + auVar1._0_4_;
        auVar12 = vfmadd231ss_fma(auVar12,auVar1,ZEXT416((uint)(p[uVar6 * 2] + p[uVar6 * 2 + 2])));
        auVar11 = vfmadd231ss_fma(auVar11,auVar1,
                                  ZEXT416((uint)(p[uVar6 * 2 + 3] + p[uVar6 * 2 + 1])));
        uVar6 = uVar6 + 1;
      } while (n - 1 != uVar6);
    }
    auVar1 = vfmsub231ss_fma(ZEXT416((uint)(p[(long)(n * 2) + -1] * *p)),
                             ZEXT416((uint)p[(long)(n * 2) + -2]),ZEXT416((uint)p[1]));
    fVar10 = fVar10 + auVar1._0_4_;
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx512vl(ZEXT416((uint)fVar10),auVar9);
    uVar2 = vcmpss_avx512f(auVar9,ZEXT416(0x34000000),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar10 = (float)((uint)bVar3 * (int)(1.0 / (fVar10 * 3.0)) + (uint)!bVar3 * 0x5d5e0b6b);
    auVar12 = vfmadd213ss_fma(ZEXT416((uint)(p[(long)(n * 2) + -2] + *p)),auVar1,auVar12);
    cVar14 = fVar10 * auVar12._0_4_;
    auVar12 = vfmadd213ss_fma(ZEXT416((uint)(p[1] + p[(long)(n * 2) + -1])),auVar1,auVar11);
    cVar13 = fVar10 * auVar12._0_4_;
  }
  uVar6 = (ulong)(uint)n;
  if (0 < n) {
    uVar7 = 0;
    do {
      fVar10 = atan2f(p[uVar7 * 2 + 1] - cVar13,p[uVar7 * 2] - cVar14);
      afStack_58[uVar7] = fVar10;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (0 < n) {
    uVar7 = 0;
    do {
      aiStack_78[uVar7] = 1;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  aiStack_78[i0] = 0;
  *iret = i0;
  if (1 < m) {
    fVar10 = afStack_58[i0];
    iVar5 = 1;
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    do {
      iret[1] = i0;
      iret = iret + 1;
      auVar11._0_4_ = (float)iVar5;
      auVar11._4_12_ = in_register_000014c4;
      auVar11 = vfmadd213ss_fma(auVar11,ZEXT416((uint)(6.2831855 / (float)m)),ZEXT416((uint)fVar10))
      ;
      uVar2 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0x40490fdb),0),0xe);
      bVar3 = (bool)((byte)uVar2 & 1);
      if (0 < n) {
        uVar7 = 0;
        fVar15 = 1e+09;
        do {
          if (aiStack_78[uVar7] != 0) {
            auVar1 = vandps_avx(ZEXT416((uint)(afStack_58[uVar7] -
                                              (float)((uint)bVar3 *
                                                      (int)(auVar11._0_4_ + -6.2831855) +
                                                     (uint)!bVar3 * (int)auVar11._0_4_))),auVar12);
            uVar2 = vcmpss_avx512f(auVar1,SUB6416(ZEXT464(0x40490fdb),0),0xe);
            bVar4 = (bool)((byte)uVar2 & 1);
            fVar8 = (float)((uint)bVar4 * (int)(6.2831855 - auVar1._0_4_) +
                           (uint)!bVar4 * (int)auVar1._0_4_);
            if (fVar8 < fVar15) {
              *iret = (int)uVar7;
              fVar15 = fVar8;
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      aiStack_78[*iret] = 0;
      iVar5 = iVar5 + 1;
    } while (iVar5 != m);
  }
  return;
}

Assistant:

void cullPoints2(int n, cbtScalar p[], int m, int i0, int iret[])
{
	// compute the centroid of the polygon in cx,cy
	int i, j;
	cbtScalar a, cx, cy, q;
	if (n == 1)
	{
		cx = p[0];
		cy = p[1];
	}
	else if (n == 2)
	{
		cx = cbtScalar(0.5) * (p[0] + p[2]);
		cy = cbtScalar(0.5) * (p[1] + p[3]);
	}
	else
	{
		a = 0;
		cx = 0;
		cy = 0;
		for (i = 0; i < (n - 1); i++)
		{
			q = p[i * 2] * p[i * 2 + 3] - p[i * 2 + 2] * p[i * 2 + 1];
			a += q;
			cx += q * (p[i * 2] + p[i * 2 + 2]);
			cy += q * (p[i * 2 + 1] + p[i * 2 + 3]);
		}
		q = p[n * 2 - 2] * p[1] - p[0] * p[n * 2 - 1];
		if (cbtFabs(a + q) > SIMD_EPSILON)
		{
			a = 1.f / (cbtScalar(3.0) * (a + q));
		}
		else
		{
			a = BT_LARGE_FLOAT;
		}
		cx = a * (cx + q * (p[n * 2 - 2] + p[0]));
		cy = a * (cy + q * (p[n * 2 - 1] + p[1]));
	}

	// compute the angle of each point w.r.t. the centroid
	cbtScalar A[8];
	for (i = 0; i < n; i++) A[i] = cbtAtan2(p[i * 2 + 1] - cy, p[i * 2] - cx);

	// search for points that have angles closest to A[i0] + i*(2*pi/m).
	int avail[8];
	for (i = 0; i < n; i++) avail[i] = 1;
	avail[i0] = 0;
	iret[0] = i0;
	iret++;
	for (j = 1; j < m; j++)
	{
		a = cbtScalar(j) * (2 * M__PI / m) + A[i0];
		if (a > M__PI) a -= 2 * M__PI;
		cbtScalar maxdiff = 1e9, diff;

		*iret = i0;  // iret is not allowed to keep this value, but it sometimes does, when diff=#QNAN0

		for (i = 0; i < n; i++)
		{
			if (avail[i])
			{
				diff = cbtFabs(A[i] - a);
				if (diff > M__PI) diff = 2 * M__PI - diff;
				if (diff < maxdiff)
				{
					maxdiff = diff;
					*iret = i;
				}
			}
		}
#if defined(DEBUG) || defined(_DEBUG)
		cbtAssert(*iret != i0);  // ensure iret got set
#endif
		avail[*iret] = 0;
		iret++;
	}
}